

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O2

long testIdentifyType(int count)

{
  long lVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  string messageString;
  FieldBase local_1d8;
  Heartbeat message;
  
  FIX42::Heartbeat::Heartbeat(&message);
  FIX::Message::toString_abi_cxx11_((int)&messageString,(int)&message,8);
  lVar1 = GetTickCount();
  iVar3 = 0;
  if (0 < count) {
    iVar3 = count;
  }
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    FIX::identifyType((MsgType *)&local_1d8,&messageString);
    FIX::FieldBase::~FieldBase(&local_1d8);
  }
  lVar2 = GetTickCount();
  std::__cxx11::string::~string((string *)&messageString);
  FIX::Message::~Message((Message *)&message);
  return lVar2 - lVar1;
}

Assistant:

long testIdentifyType(int count) {
  FIX42::Heartbeat message;
  std::string messageString = message.toString();

  count = count - 1;

  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    FIX::identifyType(messageString);
  }

  return GetTickCount() - start;
}